

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_image_color(nk_context *ctx,nk_image img,nk_color col)

{
  nk_window *pnVar1;
  nk_widget_layout_states nVar2;
  nk_rect local_20;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4cd9,
                  "void nk_image_color(struct nk_context *, struct nk_image, struct nk_color)");
  }
  pnVar1 = ctx->current;
  if (pnVar1 != (nk_window *)0x0) {
    if (pnVar1->layout != (nk_panel *)0x0) {
      nVar2 = nk_widget(&local_20,ctx);
      if (nVar2 != NK_WIDGET_INVALID) {
        nk_draw_image(&pnVar1->buffer,local_20,&img,col);
      }
      return;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4cdb,
                  "void nk_image_color(struct nk_context *, struct nk_image, struct nk_color)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x4cda,"void nk_image_color(struct nk_context *, struct nk_image, struct nk_color)")
  ;
}

Assistant:

NK_API void
nk_image_color(struct nk_context *ctx, struct nk_image img, struct nk_color col)
{
    struct nk_window *win;
    struct nk_rect bounds;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout) return;

    win = ctx->current;
    if (!nk_widget(&bounds, ctx)) return;
    nk_draw_image(&win->buffer, bounds, &img, col);
}